

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testNNValidatorBadOutput2(void)

{
  bool bVar1;
  ResultReason RVar2;
  ModelDescription *pMVar3;
  FeatureDescription *pFVar4;
  FeatureType *this;
  ArrayFeatureType *this_00;
  NeuralNetwork *this_01;
  NeuralNetworkLayer *this_02;
  ostream *poVar5;
  undefined1 local_a8 [8];
  Result res;
  InnerProductLayerParams *innerProductParams;
  NeuralNetworkLayer *innerProductLayer;
  NeuralNetwork *nn;
  FeatureDescription *out;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar3 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar4 = CoreML::Specification::ModelDescription::add_input(pMVar3);
  CoreML::Specification::FeatureDescription::set_name(pFVar4,"input");
  this = CoreML::Specification::FeatureDescription::mutable_type(pFVar4);
  this_00 = CoreML::Specification::FeatureType::mutable_multiarraytype(this);
  CoreML::Specification::ArrayFeatureType::add_shape(this_00,1);
  pMVar3 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar4 = CoreML::Specification::ModelDescription::add_output(pMVar3);
  CoreML::Specification::FeatureDescription::set_name(pFVar4,"output");
  this_01 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  this_02 = CoreML::Specification::NeuralNetwork::add_layers(this_01);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_02,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_02,"output");
  res.m_message.field_2._8_8_ =
       CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct(this_02);
  CoreML::Specification::InnerProductLayerParams::set_hasbias
            ((InnerProductLayerParams *)res.m_message.field_2._8_8_,false);
  CoreML::validate<(MLModelType)500>((Result *)local_a8,(Model *)&topIn);
  bVar1 = CoreML::Result::good((Result *)local_a8);
  if (bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xa0);
    poVar5 = std::operator<<(poVar5,": error: ");
    poVar5 = std::operator<<(poVar5,"!(((res)).good())");
    poVar5 = std::operator<<(poVar5," was false, expected true.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    m1._oneof_case_[0] = 1;
  }
  else {
    RVar2 = CoreML::Result::reason((Result *)local_a8);
    if (RVar2 == MODEL_OUTPUT_TYPE_INVALID) {
      m1._oneof_case_[0] = 0;
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xa0);
      poVar5 = std::operator<<(poVar5,": error: ");
      poVar5 = std::operator<<(poVar5,
                               "((ResultReason::MODEL_OUTPUT_TYPE_INVALID)) == ((res).reason())");
      poVar5 = std::operator<<(poVar5," was false, expected true.");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      m1._oneof_case_[0] = 1;
    }
  }
  CoreML::Result::~Result((Result *)local_a8);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m1._oneof_case_[0];
}

Assistant:

int testNNValidatorBadOutput2() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("output");

    auto *nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *innerProductLayer = nn->add_layers();
    innerProductLayer->add_input("input");
    innerProductLayer->add_output("output");
    Specification::InnerProductLayerParams *innerProductParams = innerProductLayer->mutable_innerproduct();

    innerProductParams->set_hasbias(false);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD_WITH_REASON(res, ResultReason::MODEL_OUTPUT_TYPE_INVALID);

    return 0;
}